

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamNotationDeclaration>::copyAppend
          (QGenericArrayOps<QXmlStreamNotationDeclaration> *this,QXmlStreamNotationDeclaration *b,
          QXmlStreamNotationDeclaration *e)

{
  qsizetype *pqVar1;
  QXmlStreamNotationDeclaration *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QXmlStreamNotationDeclaration>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QXmlStreamNotationDeclaration>).size;
      pDVar4 = (b->m_name).m_string.d;
      pQVar2[lVar3].m_name.m_string.d = pDVar4;
      pQVar2[lVar3].m_name.m_string.ptr = (b->m_name).m_string.ptr;
      pQVar2[lVar3].m_name.m_string.size = (b->m_name).m_string.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar4 = (b->m_systemId).m_string.d;
      pQVar2[lVar3].m_systemId.m_string.d = pDVar4;
      pQVar2[lVar3].m_systemId.m_string.ptr = (b->m_systemId).m_string.ptr;
      pQVar2[lVar3].m_systemId.m_string.size = (b->m_systemId).m_string.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->m_publicId).m_string.d;
      pQVar2[lVar3].m_publicId.m_string.d = pDVar4;
      pQVar2[lVar3].m_publicId.m_string.ptr = (b->m_publicId).m_string.ptr;
      pQVar2[lVar3].m_publicId.m_string.size = (b->m_publicId).m_string.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QXmlStreamNotationDeclaration>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }